

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O2

bool __thiscall
KeyFileReader<NWN::ResRef16>::GetEncapsulatedFileEntry
          (KeyFileReader<NWN::ResRef16> *this,FileId FileIndex,ResRefIf *ResRef,ResType *Type)

{
  pointer p_Var1;
  undefined8 uVar2;
  pointer p_Var3;
  
  p_Var1 = (this->m_KeyResDir).
           super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var3 = (pointer)0x0;
  if (FileIndex <
      (ulong)(((long)(this->m_KeyResDir).
                     super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var1) / 0x28)) {
    p_Var3 = p_Var1 + FileIndex;
  }
  if (p_Var3 != (pointer)0x0) {
    ResRef->RefStr[0x10] = '\0';
    ResRef->RefStr[0x11] = '\0';
    ResRef->RefStr[0x12] = '\0';
    ResRef->RefStr[0x13] = '\0';
    ResRef->RefStr[0x14] = '\0';
    ResRef->RefStr[0x15] = '\0';
    ResRef->RefStr[0x16] = '\0';
    ResRef->RefStr[0x17] = '\0';
    ResRef->RefStr[0x18] = '\0';
    ResRef->RefStr[0x19] = '\0';
    ResRef->RefStr[0x1a] = '\0';
    ResRef->RefStr[0x1b] = '\0';
    ResRef->RefStr[0x1c] = '\0';
    ResRef->RefStr[0x1d] = '\0';
    ResRef->RefStr[0x1e] = '\0';
    ResRef->RefStr[0x1f] = '\0';
    ResRef->RefStr[0] = '\0';
    ResRef->RefStr[1] = '\0';
    ResRef->RefStr[2] = '\0';
    ResRef->RefStr[3] = '\0';
    ResRef->RefStr[4] = '\0';
    ResRef->RefStr[5] = '\0';
    ResRef->RefStr[6] = '\0';
    ResRef->RefStr[7] = '\0';
    ResRef->RefStr[8] = '\0';
    ResRef->RefStr[9] = '\0';
    ResRef->RefStr[10] = '\0';
    ResRef->RefStr[0xb] = '\0';
    ResRef->RefStr[0xc] = '\0';
    ResRef->RefStr[0xd] = '\0';
    ResRef->RefStr[0xe] = '\0';
    ResRef->RefStr[0xf] = '\0';
    uVar2 = *(undefined8 *)((long)(p_Var3->Res).ResRef.RefStr + 8);
    *(undefined8 *)ResRef->RefStr = *(undefined8 *)(p_Var3->Res).ResRef.RefStr;
    *(undefined8 *)(ResRef->RefStr + 8) = uVar2;
    *Type = (p_Var3->Res).ResourceType;
  }
  return p_Var3 != (pointer)0x0;
}

Assistant:

bool
KeyFileReader< ResRefT >::GetEncapsulatedFileEntry(
	 typename KeyFileReader< ResRefT >::FileId FileIndex,
     ResRefIf & ResRef,
	 ResType & Type
	)
/*++

Routine Description:

	This routine reads an encapsulated file directory entry, returning the name
	and type of a particular resource.  The enumeration is stable across calls.

Arguments:

	FileIndex - Supplies the index into the logical directory entry to reutrn.

	ResRef - Receives the resource name.

	Type - Receives the resource type.

Return Value:

	The routine returns a Boolean value indicating success or failure.  The
	routine always succeeds as long as the caller provides a legal file index.

Environment:

	User mode.

--*/
{
	PCKEY_RESOURCE_DESCRIPTOR ResKey;

	ResKey = LookupResourceKey( (ResID) FileIndex );

	if (ResKey == NULL)
		return false;

	ZeroMemory( &ResRef, sizeof( ResRef ) );
	memcpy( &ResRef, &ResKey->Res.ResRef, sizeof( ResKey->Res.ResRef ) );
	Type = ResKey->Res.ResourceType;

	return true;
}